

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_ae198::ToString::visit(ToString *this,FieldBegin fb)

{
  string_view x;
  ostream *poVar1;
  ostream *poVar2;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  poVar2 = (ostream *)&stack0x00000008;
  x._len = in_stack_ffffffffffffffe0;
  x._ptr = in_stack_ffffffffffffffd8;
  poVar1 = mserialize::operator<<(poVar2,x);
  std::operator<<(poVar1,'(');
  poVar2 = mserialize::operator<<(poVar2,*(string_view *)(poVar2 + 0x10));
  std::operator<<(poVar2,"): ");
  return;
}

Assistant:

void visit(mserialize::Visitor::FieldBegin fb)    { _str << fb.name << '(' << fb.tag << "): "; }